

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

HelicsFederate helicsCreateCallbackFederateFromConfig(char *configFile,HelicsError *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  HelicsFederate pvVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_59;
  CallbackFederate *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  shared_ptr<helics::Federate> local_28;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    if (configFile == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar2 = strlen(configFile);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,configFile,configFile + sVar2);
    }
    local_58 = (CallbackFederate *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::CallbackFederate,std::allocator<helics::CallbackFederate>,std::__cxx11::string_const>
              (&_Stack_50,&local_58,(allocator<helics::CallbackFederate> *)&local_59,&local_48);
    local_28.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_50._M_pi;
    if (local_58 == (CallbackFederate *)0x0) {
      peVar4 = (element_type *)0x0;
    }
    else {
      peVar4 = (element_type *)
               ((long)&(local_58->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate
               + (long)(local_58->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate
                       [-3]);
    }
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58 = (CallbackFederate *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_28.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    pvVar3 = generateNewHelicsFederateObject(&local_28,CALLBACK);
    if (local_28.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    pvVar3 = (HelicsFederate)0x0;
  }
  return pvVar3;
}

Assistant:

HelicsFederate helicsCreateCallbackFederateFromConfig(const char* configFile, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    std::shared_ptr<helics::Federate> fed;
    try {
        fed = std::make_shared<helics::CallbackFederate>(AS_STRING(configFile));
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }

    return generateNewHelicsFederateObject(std::move(fed), helics::FederateType::CALLBACK);
}